

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

long duckdb::GreatestCommonDivisor<long>(long left,long right)

{
  long lVar1;
  OutOfRangeException *pOVar2;
  string local_48;
  
  if ((right == -1 && left == -0x8000000000000000) || (right == -0x8000000000000000 && left == -1))
  {
    lVar1 = 1;
  }
  else {
    if (left != 0) {
      do {
        right = right % left;
        if (right == 0) {
          if (left == -0x8000000000000000) {
            pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_48,"Overflow on abs(%d)","");
            OutOfRangeException::OutOfRangeException<long>(pOVar2,&local_48,-0x8000000000000000);
            __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
          }
          if (left < 1) {
            return -left;
          }
          return left;
        }
        left = left % right;
      } while (left != 0);
    }
    if (right == -0x8000000000000000) {
      pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Overflow on abs(%d)","");
      OutOfRangeException::OutOfRangeException<long>(pOVar2,&local_48,-0x8000000000000000);
      __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar1 = -right;
    if (0 < right) {
      lVar1 = right;
    }
  }
  return lVar1;
}

Assistant:

TA GreatestCommonDivisor(TA left, TA right) {
	TA a = left;
	TA b = right;

	// This protects the following modulo operations from a corner case,
	// where we would get a runtime error due to an integer overflow.
	if ((left == NumericLimits<TA>::Minimum() && right == -1) ||
	    (left == -1 && right == NumericLimits<TA>::Minimum())) {
		return 1;
	}

	while (true) {
		if (a == 0) {
			return TryAbsOperator::Operation<TA, TA>(b);
		}
		b %= a;

		if (b == 0) {
			return TryAbsOperator::Operation<TA, TA>(a);
		}
		a %= b;
	}
}